

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O3

void Test7(void)

{
  CMReturn In;
  long lVar1;
  long *plVar2;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  string in;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  CMReturn res;
  ConfusableMatcher matcher;
  allocator_type local_21ea;
  allocator_type local_21e9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_21e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_21d0;
  long *local_21b8;
  long local_21b0;
  long local_21a8 [2];
  string local_2198;
  string local_2178;
  CM_RETURN_STATUS *local_2158;
  uint64_t uStack_2150;
  CM_RETURN_STATUS local_2148;
  undefined4 uStack_2144;
  undefined1 local_2140;
  undefined7 uStack_213f;
  undefined1 uStack_2138;
  undefined7 uStack_2137;
  undefined1 uStack_2130;
  undefined7 uStack_212f;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2110;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20f8;
  unsigned_long local_20e0 [4];
  CMReturn local_20c0;
  undefined1 *local_20a0 [2];
  undefined1 local_2090 [16];
  long *local_2080 [2];
  long local_2070 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2060;
  ConfusableMatcher local_2028;
  
  GetDefaultMap_abi_cxx11_();
  local_21b8 = local_21a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_21b8,anon_var_dwarf_164b9,anon_var_dwarf_164b9 + 0x79);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2110,&local_20f8);
  local_20c0.Start = (uint64_t)&local_20c0.Status;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_20c0,"_","");
  local_20a0[0] = local_2090;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20a0,"%","");
  plVar2 = local_2070;
  local_2080[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2080,"$","");
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_2060,&local_20c0,&local_2060,0,local_20e0 + 2,local_20e0,&local_21ea);
  ConfusableMatcher::ConfusableMatcher
            (&local_2028,&local_2110,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2060,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2060);
  lVar1 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2110);
  local_2178._M_dataplus._M_p = (pointer)&local_2178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2178,local_21b8,local_21b0 + (long)local_21b8);
  local_2198._M_dataplus._M_p = (pointer)&local_2198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2198,"NIGGER","");
  local_2140 = 1;
  uStack_213f = 0;
  uStack_2138 = 0;
  uStack_2137 = 0;
  uStack_2130 = 0;
  uStack_212f = 0;
  uStack_2128 = 1000000;
  local_2120 = 0;
  uStack_2118 = 0;
  ConfusableMatcher::IndexOf
            (&local_20c0,&local_2028,&local_2178,&local_2198,
             (CMOptions)ZEXT3248(CONCAT824(1000000,CONCAT816(0,ZEXT816(1)))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2198._M_dataplus._M_p != &local_2198.field_2) {
    operator_delete(local_2198._M_dataplus._M_p,local_2198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2178._M_dataplus._M_p != &local_2178.field_2) {
    operator_delete(local_2178._M_dataplus._M_p,local_2178.field_2._M_allocated_capacity + 1);
  }
  local_2148 = local_20c0.Status;
  uStack_2144 = local_20c0._20_4_;
  local_2158 = (CM_RETURN_STATUS *)local_20c0.Start;
  uStack_2150 = local_20c0.Size;
  local_20e0[2] = 0x40;
  local_20e0[3] = 0x59;
  __l._M_len = 2;
  __l._M_array = local_20e0 + 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_21d0,__l,&local_21ea);
  local_20e0[0] = 0x39;
  local_20e0[1] = 0x20;
  __l_00._M_len = 2;
  __l_00._M_array = local_20e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_21e8,__l_00,&local_21e9)
  ;
  In.Size = uStack_2150;
  In.Start = (uint64_t)local_2158;
  In.Status = local_2148;
  In._20_4_ = uStack_2144;
  AssertMatchMulti(In,&local_21d0,&local_21e8,MATCH);
  if (local_21e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_21e8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21e8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_21d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_21d0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21d0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ConfusableMatcher::~ConfusableMatcher(&local_2028);
  if (local_21b8 != local_21a8) {
    operator_delete(local_21b8,local_21a8[0] + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20f8);
  return;
}

Assistant:

void Test7()
{
	auto map = GetDefaultMap();

	std::string in = "AAAAAAAAASSAFSAFNFNFNISFNSIFSIFJSDFUDSHF ASUF/|/__/|/___%/|/%I%%/|//|/%%%%%NNNN/|/NN__/|/N__𝘪G___%____$__G__𝓰𝘦Ѓ";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, { "_", "%", "$" });
	auto res = matcher.IndexOf(in, "NIGGER", opts);

	AssertMatchMulti(res, { 64, 89 }, { 57, 32 });
}